

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_lessthan(lua_State *L,int index1,int index2)

{
  TValue *l;
  TValue *r;
  int local_30;
  int i;
  StkId o2;
  StkId o1;
  int index2_local;
  int index1_local;
  lua_State *L_local;
  
  l = index2adr(L,index1);
  r = index2adr(L,index2);
  if ((l == &luaO_nilobject_) || (r == &luaO_nilobject_)) {
    local_30 = 0;
  }
  else {
    local_30 = luaV_lessthan(L,l,r);
  }
  return local_30;
}

Assistant:

static int lua_lessthan(lua_State*L,int index1,int index2){
StkId o1,o2;
int i;
o1=index2adr(L,index1);
o2=index2adr(L,index2);
i=(o1==(&luaO_nilobject_)||o2==(&luaO_nilobject_))?0
:luaV_lessthan(L,o1,o2);
return i;
}